

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O2

void __thiscall
TTD::ExecutionInfoManager::LoadPreservedBPInfo
          (ExecutionInfoManager *this,ThreadContext *threadContext)

{
  List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  ProbeList *pPVar1;
  Probe *pPVar2;
  FunctionBody *this_01;
  undefined8 uVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_02;
  ScriptContext **ppSVar7;
  DebugContext *pDVar8;
  HeapAllocator *this_03;
  TTDebuggerSourceLocation *this_04;
  Type *pTVar9;
  int i;
  long lVar10;
  int index;
  BreakpointProbe *bp;
  int32 j;
  int index_00;
  undefined **local_c8;
  TTDebuggerSourceLocation *bpLocation;
  size_t local_b8;
  char *local_b0;
  DWORD local_a8;
  ExecutionInfoManager *local_a0;
  List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *local_98;
  TTDebuggerSourceLocation *local_90;
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *local_88;
  undefined1 local_80 [8];
  List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  bpIdsToDelete;
  uint local_3c;
  ULONG local_38;
  LONG local_34;
  ULONG srcLine;
  LONG srcColumn;
  
  this_00 = &this->m_unRestoredBreakpoints;
  local_a0 = this;
  while( true ) {
    local_80 = (undefined1  [8])0x0;
    bVar5 = JsUtil::
            ReadOnlyList<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_DefaultComparer>::
            Contains(&this_00->
                      super_ReadOnlyList<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_DefaultComparer>
                     ,(TTDebuggerSourceLocation **)local_80);
    if (!bVar5) break;
    local_80 = (undefined1  [8])0x0;
    JsUtil::
    List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Remove(this_00,(TTDebuggerSourceLocation **)local_80);
  }
  this_02 = ThreadContextTTD::GetTTDContexts(threadContext->TTDContext);
  local_90 = (TTDebuggerSourceLocation *)&PTR_IsReadOnly_01381ef8;
  local_98 = this_00;
  local_88 = this_02;
  for (index = 0;
      index < (this_02->
              super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>).count
      ; index = index + 1) {
    ppSVar7 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::
              Item(&this_02->
                    super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>,
                   index);
    bpIdsToDelete._40_8_ = *ppSVar7;
    bpIdsToDelete.super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>._16_8_ =
         &Memory::HeapAllocator::Instance;
    local_80 = (undefined1  [8])local_90;
    bpIdsToDelete.super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>.
    _vptr_ReadOnlyList = (_func_int **)0x0;
    bpIdsToDelete.super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>.buffer.
    _0_4_ = 0;
    bpIdsToDelete.super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>.alloc =
         (Type)0x400000000;
    pDVar8 = Js::ScriptContext::GetDebugContext((ScriptContext *)bpIdsToDelete._40_8_);
    pPVar1 = pDVar8->diagProbesContainer->diagProbeList;
    for (lVar10 = 0; this_02 = local_88,
        lVar10 < (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
                 count; lVar10 = lVar10 + 1) {
      pPVar2 = (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
               buffer[lVar10];
      if (local_a0->m_activeBPId != (ulong)*(uint *)&pPVar2[4].super_HaltCallback._vptr_HaltCallback
         ) {
        this_01 = (FunctionBody *)pPVar2[3].super_HaltCallback._vptr_HaltCallback;
        uVar6 = Js::FunctionBody::GetEnclosingStatementIndexFromByteCode
                          (this_01,*(int *)((long)&pPVar2[1].super_HaltCallback._vptr_HaltCallback +
                                           4),false);
        local_38 = 0;
        local_34 = -1;
        uVar6 = Js::FunctionBody::GetStatementStartOffset(this_01,uVar6);
        Js::FunctionBody::GetSourceLineFromStartOffset_TTD(this_01,uVar6,&local_38,&local_34);
        local_c8 = &TTDebuggerSourceLocation::typeinfo;
        bpLocation = (TTDebuggerSourceLocation *)0x0;
        local_b8 = 0xffffffffffffffff;
        local_b0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTExecutionInfo.cpp"
        ;
        local_a8 = 0x336;
        this_03 = Memory::HeapAllocator::TrackAllocInfo
                            (&Memory::HeapAllocator::Instance,
                             (TrackAllocData *)&stack0xffffffffffffff38);
        this_04 = (TTDebuggerSourceLocation *)Memory::HeapAllocator::AllocT<true>(this_03,0x40);
        TTDebuggerSourceLocation::TTDebuggerSourceLocation(this_04);
        local_c8 = (undefined **)TTD_MEM_ALLOC_CHECK<TTD::TTDebuggerSourceLocation>(this_04);
        TTDebuggerSourceLocation::SetLocationWithBP
                  ((TTDebuggerSourceLocation *)local_c8,
                   (ulong)*(uint *)&pPVar2[4].super_HaltCallback._vptr_HaltCallback,this_01,local_38
                   ,local_34);
        JsUtil::
        List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(local_98,(TTDebuggerSourceLocation **)&stack0xffffffffffffff38);
        local_3c = *(uint *)&pPVar2[4].super_HaltCallback._vptr_HaltCallback;
        JsUtil::
        List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
                  ((List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    *)local_80,&local_3c);
      }
    }
    for (index_00 = 0;
        index_00 <
        (int)bpIdsToDelete.super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>.
             buffer; index_00 = index_00 + 1) {
      uVar3 = *(undefined8 *)(bpIdsToDelete._40_8_ + 0x13f8);
      pcVar4 = *(code **)(bpIdsToDelete._40_8_ + 0x1410);
      pTVar9 = JsUtil::
               List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item((List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       *)local_80,index_00);
      (*pcVar4)(uVar3,*pTVar9);
    }
    if (index == (this_02->
                 super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>).
                 count + -1) {
      (**(code **)(bpIdsToDelete._40_8_ + 0x1418))(*(undefined8 *)(bpIdsToDelete._40_8_ + 0x13f8));
    }
    JsUtil::List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::~List((List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)local_80);
  }
  return;
}

Assistant:

void ExecutionInfoManager::LoadPreservedBPInfo(ThreadContext* threadContext)
    {
        while(this->m_unRestoredBreakpoints.Contains(nullptr))
        {
            this->m_unRestoredBreakpoints.Remove(nullptr);
        }

        const JsUtil::List<Js::ScriptContext*, HeapAllocator>& ctxs = threadContext->TTDContext->GetTTDContexts();
        for(int32 i = 0; i < ctxs.Count(); ++i)
        {
            Js::ScriptContext* ctx = ctxs.Item(i);
            JsUtil::List<uint32, HeapAllocator> bpIdsToDelete(&HeapAllocator::Instance);

            Js::ProbeContainer* probeContainer = ctx->GetDebugContext()->GetProbeContainer();
            probeContainer->MapProbes([&](int j, Js::Probe* pProbe)
            {
                Js::BreakpointProbe* bp = (Js::BreakpointProbe*)pProbe;
                if((int64)bp->GetId() != this->m_activeBPId)
                {
                    Js::FunctionBody* body = bp->GetFunctionBody();
                    int32 bpIndex = body->GetEnclosingStatementIndexFromByteCode(bp->GetBytecodeOffset());

                    ULONG srcLine = 0;
                    LONG srcColumn = -1;
                    uint32 startOffset = body->GetStatementStartOffset(bpIndex);
                    body->GetSourceLineFromStartOffset_TTD(startOffset, &srcLine, &srcColumn);

                    TTDebuggerSourceLocation* bpLocation = TT_HEAP_NEW(TTDebuggerSourceLocation);
                    bpLocation->SetLocationWithBP(bp->GetId(), body, srcLine, srcColumn);
                    this->m_unRestoredBreakpoints.Add(bpLocation);

                    bpIdsToDelete.Add(bp->GetId());
                }
            });

            for(int32 j = 0; j < bpIdsToDelete.Count(); ++j)
            {
                ctx->TTDHostCallbackFunctor.pfOnBPDeleteCallback(ctx->TTDHostCallbackFunctor.HostRuntime, bpIdsToDelete.Item(j));
            }

            //done with last context so release the debug document dictionary info
            if(i == ctxs.Count() - 1)
            {
                ctx->TTDHostCallbackFunctor.pfOnBPClearDocumentCallback(ctx->TTDHostCallbackFunctor.HostRuntime);
            }
        }
    }